

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingDistributions.cpp
# Opt level: O2

tuple<float,_float> getMoments(vector<float,_std::allocator<float>_> *results)

{
  iterator __begin1;
  float *pfVar1;
  iterator __end1;
  undefined8 *in_RSI;
  double dVar2;
  tuple<float,_float> tVar3;
  float fVar4;
  float fVar5;
  
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    ((float *)*in_RSI,(float *)in_RSI[1],0.0);
  tVar3.super__Tuple_impl<0UL,_float,_float>.super__Head_base<0UL,_float,_false>._M_head_impl =
       (float)((ulong)dVar2 >> 0x20);
  pfVar1 = (float *)*in_RSI;
  fVar4 = (float)(ulong)((long)in_RSI[1] - (long)pfVar1 >> 2);
  tVar3.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
  super__Head_base<1UL,_float,_false>._M_head_impl = (float)dVar2 / fVar4;
  fVar5 = 0.0;
  for (; pfVar1 != (float *)in_RSI[1]; pfVar1 = pfVar1 + 1) {
    fVar5 = fVar5 + (*pfVar1 -
                    tVar3.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
                    super__Head_base<1UL,_float,_false>._M_head_impl) *
                    (*pfVar1 -
                    tVar3.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
                    super__Head_base<1UL,_float,_false>._M_head_impl);
  }
  *(float *)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start = fVar5 / fVar4;
  ((_Head_base<1UL,_float,_false> *)
  ((long)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start + 4))->_M_head_impl =
       tVar3.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
       super__Head_base<1UL,_float,_false>._M_head_impl;
  return (tuple<float,_float>)tVar3.super__Tuple_impl<0UL,_float,_float>;
}

Assistant:

std::tuple<float, float> getMoments (std::vector <float> results){
	float sum = std::accumulate(results.begin(), results.end(), 0.0);
	float mean = sum / results.size();

	float sq_sum = 0.0;
	for (float x: results){
		sq_sum += (x-mean)*(x-mean);
	}
	float variance = sq_sum / results.size();

	return std::make_tuple(mean, variance);
}